

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

Complex __thiscall rtb::Filter::Filter<double>::feedbackCoefficientsProduct(Filter<double> *this)

{
  pointer pcVar1;
  double dVar2;
  double dVar3;
  complex<double> *in_RAX;
  ulong in_RDX;
  ulong uVar4;
  uint uVar5;
  Complex CVar6;
  double local_68;
  double dStack_60;
  complex<double> local_58;
  undefined1 local_48 [24];
  
  uVar4 = this->n_;
  dVar2 = 0.0;
  dVar3 = 0.0;
  if (1 < uVar4) {
    in_RDX = 1;
    uVar5 = 2;
    do {
      local_48._8_4_ = SUB84(dVar3,0);
      local_48._0_8_ = dVar2;
      local_48._12_4_ = (int)((ulong)dVar3 >> 0x20);
      uVar4 = ((uVar4 - in_RDX) + this->count_) % uVar4;
      pcVar1 = (this->y_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->y_).
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      Polynomial<double>::getCoefficient(&(this->tf_).denominator_,uVar5 - 1);
      pcVar1 = pcVar1 + uVar4;
      local_68 = *(double *)pcVar1->_M_value;
      dStack_60 = *(double *)(pcVar1->_M_value + 8);
      in_RAX = std::complex<double>::operator*=((complex<double> *)&local_68,&local_58);
      dVar2 = (double)local_48._0_8_ + local_68;
      dVar3 = (double)local_48._8_8_ + dStack_60;
      in_RDX = (ulong)uVar5;
      uVar4 = this->n_;
      uVar5 = uVar5 + 1;
    } while (in_RDX < uVar4);
  }
  CVar6._M_value._8_8_ = in_RDX;
  CVar6._M_value._0_8_ = in_RAX;
  return (Complex)CVar6._M_value;
}

Assistant:

typename Filter<T>::Complex Filter<T>::feedbackCoefficientsProduct() const {

            Complex result{ 0 };
            for (unsigned k{ 1 }; k < n_; ++k)
                result += y_.at((n_ - k + count_) % n_)*tf_.a(k);
            return -result;
        }